

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::ROL_AC(CPU *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = this->A;
  bVar2 = bVar1 * '\x02';
  bVar3 = (this->field_6).ps & 1 | bVar2;
  this->A = bVar3;
  this->cycles = 1;
  (this->field_6).ps = bVar2 & 0x80 | (this->field_6).ps & 0x7c | bVar1 >> 7 | (bVar3 == 0) * '\x02'
  ;
  return;
}

Assistant:

void CPU::ROL_AC()
{
    cycles = 2;
    uint8_t cr = C ? 0b00000001 : 0;
    C = (A & 0b10000000) > 0;
    A <<= 1;
    A |= cr;
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}